

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::ObjFileImporter::createTopology
          (ObjFileImporter *this,Model *pModel,Object *pData,uint meshIndex)

{
  size_t __n;
  Face *pFVar1;
  uint uVar2;
  _Head_base<0UL,_aiMesh_*,_false> _Var3;
  ulong uVar4;
  ulong *puVar5;
  pointer ppFVar6;
  uint *puVar7;
  uint uVar8;
  aiFace *paVar9;
  Mesh *pMVar10;
  uint uVar11;
  ObjFileImporter *this_00;
  uint uVar12;
  ulong uVar13;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> pMesh;
  _Head_base<0UL,_aiMesh_*,_false> local_68;
  uint local_5c;
  Mesh *local_58;
  ulong local_50;
  uint local_44;
  Model *local_40;
  Object *local_38;
  
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x13c,
                  "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                 );
  }
  if ((pData == (Object *)0x0) ||
     (pMVar10 = (pModel->m_Meshes).
                super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>
                ._M_impl.super__Vector_impl_data._M_start[meshIndex], pMVar10 == (Mesh *)0x0)) {
    _Var3._M_head_impl = (aiMesh *)0x0;
  }
  else {
    _Var3._M_head_impl = (aiMesh *)0x0;
    if ((pMVar10->m_Faces).
        super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(pMVar10->m_Faces).
                 super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                 ._M_impl + 8)) {
      local_44 = meshIndex;
      local_40 = pModel;
      local_38 = pData;
      _Var3._M_head_impl = (aiMesh *)operator_new(0x520);
      (_Var3._M_head_impl)->mPrimitiveTypes = 0;
      (_Var3._M_head_impl)->mNumVertices = 0;
      (_Var3._M_head_impl)->mNumFaces = 0;
      memset(&(_Var3._M_head_impl)->mVertices,0,0xcc);
      (_Var3._M_head_impl)->mBones = (aiBone **)0x0;
      (_Var3._M_head_impl)->mMaterialIndex = 0;
      ((_Var3._M_head_impl)->mName).length = 0;
      ((_Var3._M_head_impl)->mName).data[0] = '\0';
      memset(((_Var3._M_head_impl)->mName).data + 1,0x1b,0x3ff);
      (_Var3._M_head_impl)->mNumAnimMeshes = 0;
      (_Var3._M_head_impl)->mAnimMeshes = (aiAnimMesh **)0x0;
      (_Var3._M_head_impl)->mMethod = 0;
      ((_Var3._M_head_impl)->mAABB).mMin.x = 0.0;
      ((_Var3._M_head_impl)->mAABB).mMin.y = 0.0;
      ((_Var3._M_head_impl)->mAABB).mMin.z = 0.0;
      ((_Var3._M_head_impl)->mAABB).mMax.x = 0.0;
      ((_Var3._M_head_impl)->mAABB).mMax.y = 0.0;
      ((_Var3._M_head_impl)->mAABB).mMax.z = 0.0;
      this_00 = (ObjFileImporter *)(_Var3._M_head_impl)->mColors;
      memset(this_00,0,0xa0);
      __n = (pMVar10->m_name)._M_string_length;
      local_68._M_head_impl = _Var3._M_head_impl;
      if (0xfffffffffffffc00 < __n - 0x400) {
        ((_Var3._M_head_impl)->mName).length = (ai_uint32)__n;
        this_00 = (ObjFileImporter *)((_Var3._M_head_impl)->mName).data;
        memcpy(this_00,(pMVar10->m_name)._M_dataplus._M_p,__n);
        ((_Var3._M_head_impl)->mName).data[__n] = '\0';
      }
      ppFVar6 = (pMVar10->m_Faces).
                super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pMVar10->m_Faces).
                   super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                   ._M_impl + 8) != ppFVar6) {
        uVar4 = 0;
        do {
          pFVar1 = ppFVar6[uVar4];
          if (pFVar1 == (Face *)0x0) {
            __assert_fail("__null != inp",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                          ,0x154,
                          "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                         );
          }
          if (pFVar1->m_PrimitiveType == aiPrimitiveType_POINT) {
            (local_68._M_head_impl)->mNumFaces =
                 (local_68._M_head_impl)->mNumFaces +
                 (int)((ulong)((long)*(pointer *)
                                      ((long)&(pFVar1->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl + 8) -
                              *(long *)&(pFVar1->m_vertices).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data) >> 2);
            *(byte *)&(local_68._M_head_impl)->mPrimitiveTypes =
                 (byte)(local_68._M_head_impl)->mPrimitiveTypes | 1;
          }
          else if (pFVar1->m_PrimitiveType == aiPrimitiveType_LINE) {
            (local_68._M_head_impl)->mNumFaces =
                 ((int)((ulong)((long)*(pointer *)
                                       ((long)&(pFVar1->m_vertices).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl + 8) -
                               *(long *)&(pFVar1->m_vertices).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data) >> 2) +
                 (local_68._M_head_impl)->mNumFaces) - 1;
            *(byte *)&(local_68._M_head_impl)->mPrimitiveTypes =
                 (byte)(local_68._M_head_impl)->mPrimitiveTypes | 2;
          }
          else {
            (local_68._M_head_impl)->mNumFaces = (local_68._M_head_impl)->mNumFaces + 1;
            if ((ulong)((long)*(pointer *)
                               ((long)&(pFVar1->m_vertices).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl + 8) -
                       *(long *)&(pFVar1->m_vertices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data) < 0xd) {
              uVar11 = (local_68._M_head_impl)->mPrimitiveTypes | 4;
            }
            else {
              uVar11 = (local_68._M_head_impl)->mPrimitiveTypes | 8;
            }
            (local_68._M_head_impl)->mPrimitiveTypes = uVar11;
          }
          uVar4 = uVar4 + 1;
          ppFVar6 = (pMVar10->m_Faces).
                    super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          _Var3._M_head_impl = local_68._M_head_impl;
        } while (uVar4 < (ulong)((long)*(pointer *)
                                        ((long)&(pMVar10->m_Faces).
                                                super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                                ._M_impl + 8) - (long)ppFVar6 >> 3));
      }
      uVar4 = (ulong)(_Var3._M_head_impl)->mNumFaces;
      uVar11 = 0;
      if (uVar4 != 0) {
        this_00 = (ObjFileImporter *)(uVar4 * 0x10 + 8);
        local_58 = pMVar10;
        puVar5 = (ulong *)operator_new__((ulong)this_00);
        *puVar5 = uVar4;
        paVar9 = (aiFace *)(puVar5 + 1);
        do {
          paVar9->mNumIndices = 0;
          paVar9->mIndices = (uint *)0x0;
          paVar9 = paVar9 + 1;
        } while (paVar9 != (aiFace *)(puVar5 + uVar4 * 2 + 1));
        (_Var3._M_head_impl)->mFaces = (aiFace *)(puVar5 + 1);
        if (local_58->m_uiMaterialIndex != 0xffffffff) {
          (_Var3._M_head_impl)->mMaterialIndex = local_58->m_uiMaterialIndex;
        }
        ppFVar6 = (local_58->m_Faces).
                  super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = 0;
        if (*(pointer *)
             ((long)&(local_58->m_Faces).
                     super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                     ._M_impl + 8) != ppFVar6) {
          uVar4 = 0;
          uVar8 = 0;
          uVar11 = 0;
          pMVar10 = local_58;
          do {
            pFVar1 = ppFVar6[uVar4];
            uVar12 = uVar8;
            if (pFVar1->m_PrimitiveType == aiPrimitiveType_LINE) {
              if ((long)*(pointer *)
                         ((long)&(pFVar1->m_vertices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&(pFVar1->m_vertices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data != 4) {
                uVar13 = 0;
                local_5c = uVar8;
                local_50 = uVar4;
                do {
                  uVar12 = uVar8 + (int)uVar13;
                  paVar9 = (local_68._M_head_impl)->mFaces;
                  paVar9[uVar12].mNumIndices = 2;
                  this_00 = (ObjFileImporter *)0x8;
                  puVar7 = (uint *)operator_new__(8);
                  uVar11 = uVar11 + 2;
                  paVar9[uVar12].mIndices = puVar7;
                  uVar13 = uVar13 + 1;
                } while (uVar13 < ((long)*(pointer *)
                                          ((long)&(pFVar1->m_vertices).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                   *(long *)&(pFVar1->m_vertices).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data >> 2) - 1U);
                pMVar10 = local_58;
                uVar4 = local_50;
                uVar12 = local_5c + (int)uVar13;
              }
            }
            else if (pFVar1->m_PrimitiveType == aiPrimitiveType_POINT) {
              if (*(pointer *)
                   ((long)&(pFVar1->m_vertices).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                   8) != (pFVar1->m_vertices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) {
                uVar13 = 0;
                local_5c = uVar8;
                local_50 = uVar4;
                do {
                  uVar12 = (int)uVar13 + uVar8;
                  paVar9 = (local_68._M_head_impl)->mFaces;
                  paVar9[uVar12].mNumIndices = 1;
                  this_00 = (ObjFileImporter *)0x4;
                  puVar7 = (uint *)operator_new__(4);
                  paVar9[uVar12].mIndices = puVar7;
                  uVar13 = uVar13 + 1;
                } while (uVar13 < (ulong)((long)*(pointer *)
                                                 ((long)&(pFVar1->m_vertices).
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                          *(long *)&(pFVar1->m_vertices).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data >> 2));
                uVar11 = uVar11 + (int)uVar13;
                pMVar10 = local_58;
                uVar4 = local_50;
                uVar12 = local_5c + (int)uVar13;
              }
            }
            else {
              paVar9 = (local_68._M_head_impl)->mFaces;
              this_00 = (ObjFileImporter *)
                        ((long)*(pointer *)
                                ((long)&(pFVar1->m_vertices).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl + 8) -
                        *(long *)&(pFVar1->m_vertices).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data);
              uVar2 = (uint)((ulong)this_00 >> 2);
              paVar9[uVar8].mNumIndices = uVar2;
              uVar11 = uVar11 + uVar2;
              uVar12 = uVar8 + 1;
              if (uVar2 != 0) {
                this_00 = (ObjFileImporter *)((ulong)this_00 & 0x3fffffffc);
                puVar7 = (uint *)operator_new__((ulong)this_00);
                paVar9[uVar8].mIndices = puVar7;
              }
            }
            uVar8 = uVar12;
            uVar4 = uVar4 + 1;
            ppFVar6 = (pMVar10->m_Faces).
                      super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            _Var3._M_head_impl = local_68._M_head_impl;
          } while (uVar4 < (ulong)((long)*(pointer *)
                                          ((long)&(pMVar10->m_Faces).
                                                  super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                                  ._M_impl + 8) - (long)ppFVar6 >> 3));
        }
      }
      createVertexArray(this_00,local_40,local_38,local_44,_Var3._M_head_impl,uVar11);
      _Var3._M_head_impl = local_68._M_head_impl;
      local_68._M_head_impl = (aiMesh *)0x0;
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
                ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_68);
    }
  }
  return _Var3._M_head_impl;
}

Assistant:

aiMesh *ObjFileImporter::createTopology( const ObjFile::Model* pModel, const ObjFile::Object* pData, unsigned int meshIndex ) {
    // Checking preconditions
    ai_assert( NULL != pModel );

    if( NULL == pData ) {
        return NULL;
    }

    // Create faces
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ meshIndex ];
    if( !pObjMesh ) {
        return NULL;
    }

    if( pObjMesh->m_Faces.empty() ) {
        return NULL;
    }

    std::unique_ptr<aiMesh> pMesh(new aiMesh);
    if( !pObjMesh->m_name.empty() ) {
        pMesh->mName.Set( pObjMesh->m_name );
    }

    for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++)
    {
        ObjFile::Face *const inp = pObjMesh->m_Faces[ index ];
        ai_assert( NULL != inp  );

        if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size() - 1);
            pMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
        } else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size());
            pMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
        } else {
            ++pMesh->mNumFaces;
            if (inp->m_vertices.size() > 3) {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            }
        }
    }

    unsigned int uiIdxCount( 0u );
    if ( pMesh->mNumFaces > 0 ) {
        pMesh->mFaces = new aiFace[ pMesh->mNumFaces ];
        if ( pObjMesh->m_uiMaterialIndex != ObjFile::Mesh::NoMaterial ) {
            pMesh->mMaterialIndex = pObjMesh->m_uiMaterialIndex;
        }

        unsigned int outIndex( 0 );

        // Copy all data from all stored meshes
        for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++) {
            ObjFile::Face* const inp = pObjMesh->m_Faces[ index ];
            if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
                for(size_t i = 0; i < inp->m_vertices.size() - 1; ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 2;
                    f.mIndices = new unsigned int[2];
                }
                continue;
            }
            else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
                for(size_t i = 0; i < inp->m_vertices.size(); ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 1;
                    f.mIndices = new unsigned int[1];
                }
                continue;
            }

            aiFace *pFace = &pMesh->mFaces[ outIndex++ ];
            const unsigned int uiNumIndices = (unsigned int) pObjMesh->m_Faces[ index ]->m_vertices.size();
            uiIdxCount += pFace->mNumIndices = (unsigned int) uiNumIndices;
            if (pFace->mNumIndices > 0) {
                pFace->mIndices = new unsigned int[ uiNumIndices ];
            }
        }
    }

    // Create mesh vertices
    createVertexArray(pModel, pData, meshIndex, pMesh.get(), uiIdxCount);

    return pMesh.release();
}